

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::IsObjTypeSpecEquivalentImpl<true>
          (DictionaryTypeHandlerBase<unsigned_short> *this,Type *type,EquivalentPropertyEntry *entry
          )

{
  ushort uVar1;
  bool bVar2;
  ushort uVar3;
  ScriptContext *this_00;
  ushort uVar4;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<unsigned_short> *pDStack_28;
  int i;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyIndex PVar5;
  
  this_00 = Js::Type::GetScriptContext(type);
  local_38 = ScriptContext::GetPropertyNameLocked(this_00,entry->propertyId);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_38,&stack0xffffffffffffffd8,
                     (int *)((long)&propertyRecord + 4));
  PVar5 = 0xffff;
  uVar3 = 0xffff;
  if ((bVar2) && ((pDStack_28->Attributes & 8) == 0)) {
    if ((pDStack_28->flags & IsAccessor) != None) {
      return false;
    }
    uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDStack_28);
    if (uVar3 != 0xffff) {
      uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
      uVar4 = -uVar1;
      if (uVar3 < uVar1) {
        uVar4 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
      }
      PVar5 = uVar4 + uVar3;
    }
  }
  if (PVar5 == 0xffff) {
    if ((entry->slotIndex == 0xffff) && (entry->mustBeWritable == false)) {
      return true;
    }
  }
  else if ((PVar5 == entry->slotIndex) &&
          (entry->isAuxSlot == (this->super_DynamicTypeHandler).inlineSlotCapacity <= uVar3)) {
    if (entry->mustBeWritable != true) {
      return true;
    }
    if (((pDStack_28->Attributes & 4) != 0) &&
       ((pDStack_28->flags & (IsFixed|IsInitialized)) == IsInitialized)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::IsObjTypeSpecEquivalentImpl(const Type* type, const EquivalentPropertyEntry *entry)
    {
        ScriptContext* scriptContext = type->GetScriptContext();

        T absSlotIndex = Constants::NoSlot;
        PropertyIndex relSlotIndex = Constants::NoSlot;

        const PropertyRecord* propertyRecord =
            doLock ? scriptContext->GetPropertyNameLocked(entry->propertyId) : scriptContext->GetPropertyName(entry->propertyId);
        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            // We don't object type specialize accessors at this point, so if we see an accessor on an object we must have a mismatch.
            // When we add support for accessors we will need another bit on EquivalentPropertyEntry indicating whether we expect
            // a data or accessor property.
            if (descriptor->GetIsAccessor())
            {
                return false;
            }

            absSlotIndex = descriptor->template GetDataPropertyIndex<false>();
            if (absSlotIndex <= Constants::PropertyIndexMax)
            {
                relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(absSlotIndex));
            }
        }

        if (relSlotIndex != Constants::NoSlot)
        {
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable && (!(descriptor->Attributes & PropertyWritable) || descriptor->IsOrMayBecomeFixed()))
            {
                return false;
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }